

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jieba.cc
# Opt level: O3

void jieba_words_free(jieba_words_t *words)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = words->length;
  if (uVar1 != 0) {
    uVar2 = 0;
    do {
      if (words->words[uVar2] != (char *)0x0) {
        free(words->words[uVar2]);
        uVar1 = words->length;
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 < uVar1);
  }
  free(words->words);
  free(words);
  return;
}

Assistant:

void jieba_words_free(jieba_words_t* words) {
    for (size_t i = 0; i < words->length; i++) {
        if (words->words[i] != NULL) {
            free(words->words[i]);
        }
    }
    free(words->words);
    free(words);
}